

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiMerger_p.h
# Opt level: O0

void __thiscall
BamTools::Internal::MultiMerger<BamTools::Algorithms::Sort::Unsorted>::Remove
          (MultiMerger<BamTools::Algorithms::Sort::Unsorted> *this,BamReader *reader)

{
  bool bVar1;
  __type _Var2;
  long in_RSI;
  BamReader *itemReader;
  MergeItem *item;
  DataIterator dataEnd;
  DataIterator dataIter;
  string filenameToRemove;
  _Self *in_stack_fffffffffffffee8;
  _Self *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  const_iterator *in_stack_ffffffffffffff20;
  deque<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
  *in_stack_ffffffffffffff28;
  _Deque_iterator<BamTools::Internal::MergeItem,BamTools::Internal::MergeItem_const&,BamTools::Internal::MergeItem_const*>
  local_d0 [48];
  string local_a0 [32];
  BamReader *local_80;
  reference local_78;
  _Deque_iterator<BamTools::Internal::MergeItem,_BamTools::Internal::MergeItem_&,_BamTools::Internal::MergeItem_*>
  local_50;
  string local_30 [48];
  
  if (in_RSI != 0) {
    BamReader::GetFilename_abi_cxx11_((BamReader *)in_stack_fffffffffffffee8);
    std::deque<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>::begin
              ((deque<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
                *)in_stack_fffffffffffffee8);
    std::deque<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>::end
              ((deque<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
                *)in_stack_fffffffffffffee8);
    while (bVar1 = std::operator!=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8), bVar1) {
      local_78 = std::
                 _Deque_iterator<BamTools::Internal::MergeItem,_BamTools::Internal::MergeItem_&,_BamTools::Internal::MergeItem_*>
                 ::operator*(&local_50);
      local_80 = local_78->Reader;
      if (local_80 != (BamReader *)0x0) {
        BamReader::GetFilename_abi_cxx11_((BamReader *)in_stack_fffffffffffffee8);
        _Var2 = std::operator==(in_stack_ffffffffffffff10,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        std::__cxx11::string::~string(local_a0);
        if (_Var2) {
          std::
          _Deque_iterator<BamTools::Internal::MergeItem,BamTools::Internal::MergeItem_const&,BamTools::Internal::MergeItem_const*>
          ::
          _Deque_iterator<std::_Deque_iterator<BamTools::Internal::MergeItem,BamTools::Internal::MergeItem&,BamTools::Internal::MergeItem*>,void>
                    (local_d0,&local_50);
          std::deque<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
          ::erase(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
          break;
        }
      }
      std::
      _Deque_iterator<BamTools::Internal::MergeItem,_BamTools::Internal::MergeItem_&,_BamTools::Internal::MergeItem_*>
      ::operator++(in_stack_fffffffffffffef0);
    }
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

inline void MultiMerger<Algorithms::Sort::Unsorted>::Remove(BamReader* reader)
{

    if (reader == 0) return;
    const std::string filenameToRemove = reader->GetFilename();

    // iterate over readers in cache
    DataIterator dataIter = m_data.begin();
    DataIterator dataEnd = m_data.end();
    for (; dataIter != dataEnd; ++dataIter) {
        const MergeItem& item = (*dataIter);
        const BamReader* itemReader = item.Reader;
        if (itemReader == 0) continue;

        // remove iterator on match
        if (itemReader->GetFilename() == filenameToRemove) {
            m_data.erase(dataIter);
            return;
        }
    }
}